

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

word * capnp::_::WireHelpers::copyMessage
                 (SegmentBuilder **segment,CapTableBuilder *capTable,WirePointer **dst,
                 WirePointer *src)

{
  WirePointer *pWVar1;
  SegmentBuilder *pSVar2;
  undefined8 dst_00;
  ElementSize EVar3;
  bool bVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  Kind KVar7;
  BitsPerElementTableType BVar8;
  ElementCountN<29> EVar9;
  WordCountN<29> WVar10;
  uint amount;
  ListElementCount end;
  WordCountN<17> WVar11;
  unsigned_long uVar12;
  WordCount64 WVar13;
  word *pwVar14;
  word *pwVar15;
  uint *puVar16;
  Fault local_140;
  Fault f_2;
  Fault f_1;
  Iterator local_128;
  uint i_1;
  Iterator __end5_1;
  Iterator __begin5_1;
  Range<unsigned_int> *__range5_1;
  Fault local_100;
  Fault f;
  Kind local_f0;
  DebugExpression<capnp::_::WirePointer::Kind> local_ec;
  undefined1 local_e8 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  word *dstElement;
  word *srcElement;
  WirePointer *srcTag;
  WirePointer *local_a8;
  word *dstPtr_2;
  word *srcPtr_2;
  WirePointer *dstRef;
  SegmentBuilder *subSegment;
  Iterator local_80;
  uint i;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_int> *__range5;
  WirePointer *dstRefs;
  WirePointer *srcRefs;
  word *dstPtr_1;
  word *srcPtr_1;
  WordCount64 wordCount;
  word *dstPtr;
  word *srcPtr;
  WirePointer *src_local;
  WirePointer **dst_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder **segment_local;
  
  KVar7 = WirePointer::kind(src);
  switch(KVar7) {
  case STRUCT:
    bVar4 = WirePointer::isNull(src);
    if (bVar4) {
      zeroMemory(*dst);
      segment_local = (SegmentBuilder **)0x0;
    }
    else {
      pwVar14 = WirePointer::target(src,(SegmentReader *)0x0);
      WVar11 = WirePointer::StructRef::wordSize(&(src->field_1).structRef);
      segment_local =
           (SegmentBuilder **)allocate(dst,segment,capTable,WVar11,STRUCT,(BuilderArena *)0x0);
      pSVar2 = *segment;
      uVar5 = DirectWireValue<unsigned_short>::get(&(src->field_1).structRef.dataSize);
      uVar6 = DirectWireValue<unsigned_short>::get(&(src->field_1).structRef.ptrCount);
      copyStruct(pSVar2,capTable,(word *)segment_local,pwVar14,uVar5,uVar6);
      pWVar1 = *dst;
      uVar5 = DirectWireValue<unsigned_short>::get(&(src->field_1).structRef.dataSize);
      uVar6 = DirectWireValue<unsigned_short>::get(&(src->field_1).structRef.ptrCount);
      WirePointer::StructRef::set(&(pWVar1->field_1).structRef,uVar5,uVar6);
    }
    break;
  case LIST:
    EVar3 = WirePointer::ListRef::elementSize(&(src->field_1).listRef);
    if (EVar3 < POINTER) {
      EVar9 = WirePointer::ListRef::elementCount(&(src->field_1).listRef);
      uVar12 = upgradeBound<unsigned_long,unsigned_int>(EVar9);
      EVar3 = WirePointer::ListRef::elementSize(&(src->field_1).listRef);
      BVar8 = dataBitsPerElement(EVar3);
      WVar13 = roundBitsUpToWords(uVar12 * BVar8);
      pwVar14 = WirePointer::target(src,(SegmentReader *)0x0);
      pwVar15 = allocate(dst,segment,capTable,(SegmentWordCount)WVar13,LIST,(BuilderArena *)0x0);
      copyMemory(pwVar15,pwVar14,(SegmentWordCount)WVar13);
      pWVar1 = *dst;
      EVar3 = WirePointer::ListRef::elementSize(&(src->field_1).listRef);
      EVar9 = WirePointer::ListRef::elementCount(&(src->field_1).listRef);
      WirePointer::ListRef::set(&(pWVar1->field_1).listRef,EVar3,EVar9);
      return pwVar15;
    }
    if (EVar3 == POINTER) {
      pwVar14 = WirePointer::target(src,(SegmentReader *)0x0);
      EVar9 = WirePointer::ListRef::elementCount(&(src->field_1).listRef);
      pwVar15 = allocate(dst,segment,capTable,EVar9,LIST,(BuilderArena *)0x0);
      EVar9 = WirePointer::ListRef::elementCount(&(src->field_1).listRef);
      ___end5 = kj::zeroTo<unsigned_int>(EVar9);
      i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end5);
      local_80 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end5);
      while (bVar4 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_80),
            ((bVar4 ^ 0xffU) & 1) != 0) {
        puVar16 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
        subSegment._4_4_ = *puVar16;
        dstRef = (WirePointer *)*segment;
        srcPtr_2 = pwVar15 + subSegment._4_4_;
        copyMessage((SegmentBuilder **)&dstRef,capTable,(WirePointer **)&srcPtr_2,
                    (WirePointer *)(pwVar14 + subSegment._4_4_));
        kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
      }
      pWVar1 = *dst;
      EVar9 = WirePointer::ListRef::elementCount(&(src->field_1).listRef);
      WirePointer::ListRef::set(&(pWVar1->field_1).listRef,POINTER,EVar9);
      return pwVar15;
    }
    if (EVar3 == INLINE_COMPOSITE) {
      dstPtr_2 = WirePointer::target(src,(SegmentReader *)0x0);
      WVar10 = WirePointer::ListRef::inlineCompositeWordCount(&(src->field_1).listRef);
      amount = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::copyMessage(capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,capnp::_::WirePointer*&,capnp::_::WirePointer_const*)::_lambda()_1_>
                         (WVar10 + 1,(anon_class_1_0_00000001 *)((long)&srcTag + 7));
      local_a8 = (WirePointer *)allocate(dst,segment,capTable,amount,LIST,(BuilderArena *)0x0);
      pWVar1 = *dst;
      WVar10 = WirePointer::ListRef::inlineCompositeWordCount(&(src->field_1).listRef);
      WirePointer::ListRef::setInlineComposite(&(pWVar1->field_1).listRef,WVar10);
      pwVar14 = dstPtr_2;
      copyMemory<capnp::_::WirePointer>(local_a8,(WirePointer *)dstPtr_2);
      dstElement = dstPtr_2 + 1;
      _kjCondition._24_8_ = local_a8 + 1;
      local_f0 = WirePointer::kind((WirePointer *)pwVar14);
      local_ec = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f0);
      f.exception._4_4_ = 0;
      kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 local_e8,&local_ec,(Kind *)((long)&f.exception + 4));
      bVar4 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e8);
      if (bVar4) {
        end = WirePointer::inlineCompositeListElementCount((WirePointer *)pwVar14);
        ___end5_1 = kj::zeroTo<unsigned_int>(end);
        i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end5_1);
        local_128 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end5_1);
        while (bVar4 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i_1,&local_128),
              ((bVar4 ^ 0xffU) & 1) != 0) {
          kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
          dst_00 = _kjCondition._24_8_;
          pSVar2 = *segment;
          uVar5 = DirectWireValue<unsigned_short>::get
                            ((DirectWireValue<unsigned_short> *)((long)&pwVar14->content + 4));
          uVar6 = DirectWireValue<unsigned_short>::get
                            ((DirectWireValue<unsigned_short> *)((long)&pwVar14->content + 6));
          copyStruct(pSVar2,capTable,(word *)dst_00,dstElement,uVar5,uVar6);
          WVar11 = WirePointer::StructRef::wordSize((StructRef *)((long)&pwVar14->content + 4));
          dstElement = dstElement + WVar11;
          WVar11 = WirePointer::StructRef::wordSize((StructRef *)((long)&pwVar14->content + 4));
          _kjCondition._24_8_ = _kjCondition._24_8_ + (ulong)WVar11 * 8;
          kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
        }
        return (word *)local_a8;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[48]>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x3f3,FAILED,"srcTag->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"INLINE_COMPOSITE of lists is not yet supported.\"",
                 (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 local_e8,(char (*) [48])"INLINE_COMPOSITE of lists is not yet supported.");
      kj::_::Debug::Fault::fatal(&local_100);
    }
  default:
    segment_local = (SegmentBuilder **)0x0;
    break;
  case FAR:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x404,FAILED,(char *)0x0,"\"Unchecked messages cannot contain far pointers.\"",
               (char (*) [48])"Unchecked messages cannot contain far pointers.");
    kj::_::Debug::Fault::fatal(&local_140);
  case OTHER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              (&f_2,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x401,FAILED,(char *)0x0,
               "\"Unchecked messages cannot contain OTHER pointers (e.g. capabilities).\"",
               (char (*) [70])
               "Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
    kj::_::Debug::Fault::fatal(&f_2);
  }
  return (word *)segment_local;
}

Assistant:

static word* copyMessage(
      SegmentBuilder*& segment, CapTableBuilder* capTable,
      WirePointer*& dst, const WirePointer* src) {
    // Not always-inline because it's recursive.

    switch (src->kind()) {
      case WirePointer::STRUCT: {
        if (src->isNull()) {
          zeroMemory(dst);
          return nullptr;
        } else {
          const word* srcPtr = src->target(nullptr);
          word* dstPtr = allocate(
              dst, segment, capTable, src->structRef.wordSize(), WirePointer::STRUCT, nullptr);

          copyStruct(segment, capTable, dstPtr, srcPtr, src->structRef.dataSize.get(),
                     src->structRef.ptrCount.get());

          dst->structRef.set(src->structRef.dataSize.get(), src->structRef.ptrCount.get());
          return dstPtr;
        }
      }
      case WirePointer::LIST: {
        switch (src->listRef.elementSize()) {
          case ElementSize::VOID:
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto wordCount = roundBitsUpToWords(
                upgradeBound<uint64_t>(src->listRef.elementCount()) *
                dataBitsPerElement(src->listRef.elementSize()));
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable, wordCount, WirePointer::LIST, nullptr);
            copyMemory(dstPtr, srcPtr, wordCount);

            dst->listRef.set(src->listRef.elementSize(), src->listRef.elementCount());
            return dstPtr;
          }

          case ElementSize::POINTER: {
            const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src->target(nullptr));
            WirePointer* dstRefs = reinterpret_cast<WirePointer*>(
                allocate(dst, segment, capTable, src->listRef.elementCount() *
                    (ONE * POINTERS / ELEMENTS) * WORDS_PER_POINTER,
                    WirePointer::LIST, nullptr));

            for (auto i: kj::zeroTo(src->listRef.elementCount() * (ONE * POINTERS / ELEMENTS))) {
              SegmentBuilder* subSegment = segment;
              WirePointer* dstRef = dstRefs + i;
              copyMessage(subSegment, capTable, dstRef, srcRefs + i);
            }

            dst->listRef.set(ElementSize::POINTER, src->listRef.elementCount());
            return reinterpret_cast<word*>(dstRefs);
          }

          case ElementSize::INLINE_COMPOSITE: {
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable,
                assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
                    src->listRef.inlineCompositeWordCount() + POINTER_SIZE_IN_WORDS,
                    []() { KJ_FAIL_ASSERT("list too big to fit in a segment"); }),
                WirePointer::LIST, nullptr);

            dst->listRef.setInlineComposite(src->listRef.inlineCompositeWordCount());

            const WirePointer* srcTag = reinterpret_cast<const WirePointer*>(srcPtr);
            copyMemory(reinterpret_cast<WirePointer*>(dstPtr), srcTag);

            const word* srcElement = srcPtr + POINTER_SIZE_IN_WORDS;
            word* dstElement = dstPtr + POINTER_SIZE_IN_WORDS;

            KJ_ASSERT(srcTag->kind() == WirePointer::STRUCT,
                "INLINE_COMPOSITE of lists is not yet supported.");

            for (auto i KJ_UNUSED: kj::zeroTo(srcTag->inlineCompositeListElementCount())) {
              copyStruct(segment, capTable, dstElement, srcElement,
                  srcTag->structRef.dataSize.get(), srcTag->structRef.ptrCount.get());
              srcElement += srcTag->structRef.wordSize();
              dstElement += srcTag->structRef.wordSize();
            }
            return dstPtr;
          }
        }
        break;
      }
      case WirePointer::OTHER:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
        break;
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain far pointers.");
        break;
    }

    return nullptr;
  }